

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

bool slang::syntax::SyntaxFacts::isPropertyQualifier(TokenKind kind)

{
  TokenKind kind_local;
  bool local_1;
  
  if ((((kind == ConstKeyword) || (kind == LocalKeyword)) || (kind == ProtectedKeyword)) ||
     (((ushort)(kind - RandKeyword) < 2 || (kind == StaticKeyword)))) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SyntaxFacts::isPropertyQualifier(TokenKind kind) {
    switch (kind) {
        case TokenKind::ConstKeyword:
        case TokenKind::RandKeyword:
        case TokenKind::RandCKeyword:
        case TokenKind::StaticKeyword:
        case TokenKind::LocalKeyword:
        case TokenKind::ProtectedKeyword:
            return true;
        default:
            return false;
    }
}